

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::HttpRequestHeader::ParseLine
          (HttpRequestHeader *this,string *line,int lineNumber)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  string temp;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (lineNumber != 0) {
    bVar1 = HttpHeader::ParseLine(&this->super_HttpHeader,line,lineNumber);
    return bVar1;
  }
  if (line->_M_string_length != 0) {
    cVar3 = (char)line;
    lVar2 = std::__cxx11::string::find_first_not_of(cVar3,0x20);
    if (lVar2 == -1) {
      return false;
    }
    lVar2 = std::__cxx11::string::find(cVar3,0x20);
    if ((((lVar2 != -1) &&
         (lVar2 = std::__cxx11::string::find_first_not_of(cVar3,0x20), lVar2 != -1)) &&
        (lVar2 = std::__cxx11::string::find(cVar3,0x20), lVar2 != -1)) &&
       (lVar2 = std::__cxx11::string::find_first_not_of(cVar3,0x20), lVar2 != -1)) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
      std::__cxx11::string::operator=((string *)&this->m_method,(string *)&local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
      std::__cxx11::string::operator=((string *)&this->m_resource,(string *)&local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
      lVar2 = std::__cxx11::string::find((char *)&local_50,Constants::HTTP_STRING_abi_cxx11_,0);
      bVar1 = local_48 == 8 && lVar2 == 0;
      if (local_48 == 8 && lVar2 == 0) {
        cVar3 = local_50[7];
        (this->super_HttpHeader).m_majorVersion = (char)local_50[5] + -0x30;
        (this->super_HttpHeader).m_minorVersion = cVar3 + -0x30;
      }
      if (local_50 == local_40) {
        return bVar1;
      }
      operator_delete(local_50);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool HttpRequestHeader::ParseLine(const string& line, int lineNumber) {

    // if not 'request line', just let base class parse
    if ( lineNumber != 0 )
        return HttpHeader::ParseLine(line, lineNumber);

    // fail if empty line
    if ( line.empty() )
        return false;

    // walk through request line, storing positions
    //    GET /path/to/resource HTTP/1.1
    //    ^  ^^                ^^
    const size_t foundMethod = line.find_first_not_of(Constants::SPACE_CHAR); // skip any leading whitespace
    if ( foundMethod == string::npos ) return false;
    const size_t foundFirstSpace = line.find(Constants::SPACE_CHAR, foundMethod+1);
    if ( foundFirstSpace == string::npos ) return false;
    const size_t foundResource = line.find_first_not_of(Constants::SPACE_CHAR, foundFirstSpace+1);
    if ( foundResource == string::npos ) return false;
    const size_t foundSecondSpace = line.find(Constants::SPACE_CHAR, foundResource+1);
    if ( foundSecondSpace == string::npos ) return false;
    const size_t foundVersion= line.find_first_not_of(Constants::SPACE_CHAR, foundSecondSpace+1);
    if ( foundVersion == string::npos ) return false;

    // parse out method & resource
    m_method   = line.substr(foundMethod,   foundFirstSpace  - foundMethod);
    m_resource = line.substr(foundResource, foundSecondSpace - foundResource);

    // parse out version numbers
    const string temp = line.substr(foundVersion);
    if ( (temp.find(Constants::HTTP_STRING) != 0) || (temp.size() != 8) )
        return false;
    const int major = static_cast<int>(temp.at(5) - '0');
    const int minor = static_cast<int>(temp.at(7) - '0');
    SetVersion(major, minor);

    // if we get here, return success
    return true;
}